

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,AttribMap *attribs)

{
  vector<int,_std::allocator<int>_> attribList;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  attribMapToList((vector<int,_std::allocator<int>_> *)&local_38,attribs);
  chooseConfigs(__return_storage_ptr__,egl,display,local_38._M_impl.super__Vector_impl_data._M_start
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const AttribMap& attribs)
{
	const vector<EGLint>	attribList	= attribMapToList(attribs);
	return chooseConfigs(egl, display, &attribList.front());
}